

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

bool fmp4_stream::set_track_id
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,uint32_t track_id)

{
  pointer puVar1;
  int iVar2;
  uint uVar3;
  size_t k;
  pointer puVar4;
  allocator local_51;
  string local_50 [32];
  
  uVar3 = track_id >> 0x18 | (track_id & 0xff0000) >> 8 | (track_id & 0xff00) << 8 |
          track_id << 0x18;
  for (puVar4 = (pointer)0x0;
      puVar1 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,
      puVar4 < (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish + (-0x10 - (long)puVar1); puVar4 = puVar4 + 1) {
    std::__cxx11::string::string(local_50,(char *)(puVar4 + (long)puVar1),&local_51);
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    std::__cxx11::string::~string(local_50);
    puVar1 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar2 == 0) {
      *(uint *)(puVar4 + (long)(puVar1 + (ulong)(puVar4[(long)(puVar1 + 4)] == '\x01') * 8 + 0x10))
           = uVar3;
    }
    std::__cxx11::string::string(local_50,(char *)(puVar4 + (long)puVar1),&local_51);
    iVar2 = std::__cxx11::string::compare((char *)local_50);
    std::__cxx11::string::~string(local_50);
    if (iVar2 == 0) {
      puVar1 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(uint *)(puVar4 + (long)(puVar1 + (ulong)(puVar4[(long)(puVar1 + 4)] == '\x01') * 8 + 0x10))
           = uVar3;
    }
  }
  return true;
}

Assistant:

bool set_track_id(std::vector<uint8_t> &moov_in, uint32_t track_id)
	{
		bool set_tkhd = false;

		for (std::size_t k = 0; k < moov_in.size() - 16; k++)
		{
			if (std::string((char *)&moov_in[k]).compare("tkhd") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
			if (std::string((char *)&moov_in[k]).compare("trex") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
		}
		return true;
	}